

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
SourceLocationTest_GetSourceLocation_MissingSourceCodeInfo_Test::
~SourceLocationTest_GetSourceLocation_MissingSourceCodeInfo_Test
          (SourceLocationTest_GetSourceLocation_MissingSourceCodeInfo_Test *this)

{
  SourceLocationTest_GetSourceLocation_MissingSourceCodeInfo_Test *this_local;
  
  ~SourceLocationTest_GetSourceLocation_MissingSourceCodeInfo_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(SourceLocationTest, GetSourceLocation_MissingSourceCodeInfo) {
  SourceLocation loc;

  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));

  FileDescriptorProto proto;
  file_desc->CopyTo(&proto);  // Note, this discards the SourceCodeInfo.
  EXPECT_FALSE(proto.has_source_code_info());

  DescriptorPool bad1_pool(&pool_);
  const FileDescriptor* bad1_file_desc =
      ABSL_DIE_IF_NULL(bad1_pool.BuildFile(proto));
  const Descriptor* bad1_a_desc = bad1_file_desc->FindMessageTypeByName("A");
  EXPECT_FALSE(bad1_a_desc->GetSourceLocation(&loc));
}